

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall
Minisat::Solver::binDRUP<Minisat::Clause>(Solver *this,uchar op,Clause *c,FILE *drup_file)

{
  int iVar1;
  uchar *puVar2;
  OnlineProofChecker *this_00;
  byte *pbVar3;
  bool bVar4;
  anon_struct_8_10_eb538618_for_header aVar5;
  uint uVar6;
  ulong uVar7;
  Lit local_3c;
  FILE *local_38;
  
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = op;
  this->buf_len = this->buf_len + 1;
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    if (op == 'a') {
      if ((this_00->tmpLits).data != (Lit *)0x0) {
        (this_00->tmpLits).sz = 0;
      }
      aVar5 = c->header;
      local_38 = (FILE *)drup_file;
      if (0x3ffffffff < (ulong)aVar5) {
        uVar7 = 0;
        do {
          iVar1 = *(int *)(&c[1].header.field_0x0 + uVar7 * 4);
          if (iVar1 != -2) {
            local_3c.x = iVar1;
            vec<Minisat::Lit>::push(&this_00->tmpLits,&local_3c);
            aVar5 = c->header;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ulong)aVar5 >> 0x22);
      }
      bVar4 = OnlineProofChecker::addClause(this_00,&this_00->tmpLits,false);
      drup_file = (FILE *)local_38;
      if (bVar4) goto LAB_0011d330;
    }
    else {
      bVar4 = OnlineProofChecker::removeClause<Minisat::Clause>(this_00,c);
      if (bVar4) goto LAB_0011d330;
    }
    exit(0x86);
  }
LAB_0011d330:
  if (0x3ffffffff < (ulong)c->header) {
    uVar7 = 0;
    do {
      uVar6 = *(int *)(&c[1].header.field_0x0 + uVar7 * 4) + 2;
      do {
        pbVar3 = this->buf_ptr;
        this->buf_ptr = pbVar3 + 1;
        *pbVar3 = (byte)uVar6 | 0x80;
        this->buf_len = this->buf_len + 1;
        bVar4 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar4);
      this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)c->header >> 0x22);
  }
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = '\0';
  iVar1 = this->buf_len;
  uVar6 = iVar1 + 1;
  this->buf_len = uVar6;
  if (0xfffff < iVar1) {
    fwrite_unlocked(drup_buf,1,(ulong)uVar6,(FILE *)drup_file);
    this->buf_ptr = drup_buf;
    this->buf_len = 0;
  }
  return;
}

Assistant:

inline void binDRUP(unsigned char op, const V &c, FILE *drup_file)
    {
        assert(op == 'a' || op == 'd');
        *buf_ptr++ = op;
        buf_len++;
        if (onlineDratChecker) {
            if (op == 'a') {
                TRACE(if (!checkOnlineCheckerState(c)) {
                    std::cout << "c failed to validate online checker state" << std::endl;
                });

                if (!onlineDratChecker->addClause(c, lit_Undef)) {
                    exit(134);
                }
            } else {
                if (!onlineDratChecker->removeClause(c)) exit(134);
            }
        }
        for (int i = 0; i < c.size(); i++) byteDRUP(c[i]);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }